

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

bool is_obj_key(string *v,int *obj,int *gen)

{
  bool bVar1;
  int iVar2;
  string *local_50 [2];
  _Alloc_hider local_40;
  
  std::__cxx11::string::substr((ulong)local_50,(ulong)v);
  iVar2 = std::__cxx11::string::compare((char *)local_50);
  if (local_50[0] != (string *)&local_40) {
    operator_delete(local_50[0],(ulong)(local_40._M_p + 1));
  }
  if (iVar2 == 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)v);
    bVar1 = is_indirect_object(local_50[0],obj,gen);
    if (local_50[0] != (string *)&local_40) {
      operator_delete(local_50[0],(ulong)(local_40._M_p + 1));
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool
is_obj_key(std::string const& v, int& obj, int& gen)
{
    if (v.substr(0, 4) != "obj:") {
        return false;
    }
    return is_indirect_object(v.substr(4), obj, gen);
}